

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O3

void ssllabs::Endpoint::parseEndpointDetails(ConstObject *obj,labsEndpoint_t *endpoint)

{
  ushort uVar1;
  char *pcVar2;
  labsEndpointDetails_t *plVar3;
  undefined8 uVar4;
  labsEndpoint_t *plVar5;
  Number NVar6;
  Type pGVar7;
  ValueIterator pGVar8;
  Ch *pCVar9;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar10;
  ValueIterator pGVar11;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this;
  labsProtocol_t labsProtocol;
  Data local_90;
  undefined8 local_80;
  Ch local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  labsEndpoint_t *local_40;
  ConstObject local_38;
  
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"hostStartTime");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x80000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"hostStartTime");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x80000000000000)
          == (undefined1  [16])0x0) {
        __assert_fail("data_.f.flags & kInt64Flag",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                      ,0x71b,
                      "int64_t rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt64() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      (endpoint->Details).HostStartTime = (int64_t)(pGVar7->data_).n;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"key");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"key");
      if (*(short *)(NVar6.i64 + 0xe) != 3) goto LAB_0010e976;
      local_90.n = NVar6;
      parseKey((ConstObject *)&local_90.s,&(endpoint->Details).Key);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"cert");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"cert");
      if (*(short *)(NVar6.i64 + 0xe) != 3) goto LAB_0010e976;
      local_90.n = NVar6;
      parseCert((ConstObject *)&local_90.s,&(endpoint->Details).Cert);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"chain");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"chain");
      if (*(short *)(NVar6.i64 + 0xe) != 3) goto LAB_0010e976;
      local_90.n = NVar6;
      parseChain((ConstObject *)&local_90.s,&(endpoint->Details).Chain);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  local_40 = endpoint;
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"protocols");
    if ((pGVar7->data_).f.flags == 4) {
      local_90.s.str = local_78;
      local_80 = 0;
      local_78[0] = '\0';
      local_68 = &local_58;
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"protocols");
      if ((pGVar7->data_).f.flags == 4) {
        pGVar11 = (ValueIterator)((ulong)(pGVar7->data_).s.str & 0xffffffffffff);
        while( true ) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)obj->value_,"protocols");
          if ((pGVar7->data_).f.flags != 4) break;
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::End(pGVar7);
          if (pGVar11 == pGVar8) {
            if (local_68 != &local_58) {
              operator_delete(local_68);
            }
            endpoint = local_40;
            if (local_90.s.str != local_78) {
              operator_delete(local_90.s.str);
            }
            goto LAB_0010da5f;
          }
          if ((pGVar11->data_).f.flags != 3) goto LAB_0010e976;
          local_38.value_ = pGVar11;
          parseProtocosls(&local_38,(labsProtocol_t *)&local_90.s);
          std::vector<ssllabs::labsProtocol,_std::allocator<ssllabs::labsProtocol>_>::push_back
                    (&(endpoint->Details).Protocols,(value_type *)&local_90.s);
          pGVar11 = pGVar11 + 1;
        }
      }
      goto LAB_0010e5c3;
    }
  }
LAB_0010da5f:
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"suites");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"suites");
      if (*(short *)(NVar6.i64 + 0xe) != 3) goto LAB_0010e976;
      local_90.n = NVar6;
      parseLabsSuites((ConstObject *)&local_90.s,&(endpoint->Details).Suites);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"serverSignature");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"serverSignature");
      pCVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar7);
      pcVar2 = (char *)(endpoint->Details).ServerSignature._M_string_length;
      strlen(pCVar9);
      std::__cxx11::string::_M_replace
                ((ulong)&(endpoint->Details).ServerSignature,0,pcVar2,(ulong)pCVar9);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"prefixDelegation");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"prefixDelegation");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).PrefixDelegation = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"nonPrefixDelegation");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"nonPrefixDelegation");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).NonPrefixDelegation = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"vulnBeast");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"vulnBeast");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).VulnBeast = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"renegSupport");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"renegSupport");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).RenegSupport = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"sessionResumption");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"sessionResumption");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).SessionResumption = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"compressionMethods");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"compressionMethods");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).CompressionMethods = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"supportsNpn");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"supportsNpn");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).SupportsNpn = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"sessionTickets");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"sessionTickets");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).SessionTickets = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"ocspStapling");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"ocspStapling");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).OcspStapling = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"sniRequired");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"sniRequired");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).SniRequired = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"httpStatusCode");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"httpStatusCode");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).HttpStatusCode = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"supportsRc4");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"supportsRc4");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).SupportsRc4 = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"rc4WithModern");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"rc4WithModern");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).Rc4WithModern = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"rc4Only");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"rc4Only");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).Rc4Only = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"forwardSecrecy");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"forwardSecrecy");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).ForwardSecrecy = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"sims");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"sims");
      if (*(short *)(NVar6.i64 + 0xe) != 3) goto LAB_0010e976;
      local_90.n = NVar6;
      parseSimulationDetails((ConstObject *)&local_90.s,&(endpoint->Details).Sims);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"heartbleed");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"heartbleed");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).Heartbleed = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"heartbeat");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"heartbeat");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).Heartbeat = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"openSslCcs");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"openSslCcs");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).OpenSslCcs = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"poodle");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"poodle");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).Poodle = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"poodleTls");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"poodleTls");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).PoodleTls = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"fallbackScsv");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"fallbackScsv");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).FallbackScsv = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"freak");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"freak");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (endpoint->Details).Freak = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"hasSct");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"hasSct");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) goto LAB_0010e9b4;
      (endpoint->Details).HasSct = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"dhPrimes");
    if ((pGVar7->data_).f.flags == 4) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"dhPrimes");
      if ((pGVar7->data_).f.flags == 4) {
        pCVar9 = (pGVar7->data_).s.str;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)obj->value_,"dhPrimes");
        if ((pGVar10->data_).f.flags == 4) {
          this = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((ulong)pCVar9 & 0xffffffffffff);
          plVar3 = &local_40->Details;
          do {
            pGVar11 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::End(pGVar10);
            if (this == pGVar11) goto LAB_0010e5e2;
            if ((undefined1  [16])
                ((undefined1  [16])this->data_ & (undefined1  [16])0x400000000000000) !=
                (undefined1  [16])0x0) {
              pCVar9 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::GetString(this);
              std::__cxx11::string::string((string *)&local_90.s,pCVar9,(allocator *)&local_38);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &plVar3->DhPrimes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90.s);
              if (local_90.n.i64 != (Number)&local_80) {
                operator_delete((void *)local_90.n);
              }
            }
            this = this + 1;
            pGVar10 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"dhPrimes");
          } while ((pGVar10->data_).f.flags == 4);
        }
      }
LAB_0010e5c3:
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                    ,0x712,
                    "ConstArray rapidjson::GenericValue<rapidjson::UTF8<>>::GetArray() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
LAB_0010e5e2:
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  plVar5 = local_40;
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"dhUsesKnownPrimes");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"dhUsesKnownPrimes");
      if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) {
LAB_0010e9b4:
        __assert_fail("data_.f.flags & kIntFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      (plVar5->Details).DhUsesKnownPrimes = (pGVar7->data_).s.length;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"dhYsReuse");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"dhYsReuse");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (plVar5->Details).DhYsReuse = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"logjam");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"logjam");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (plVar5->Details).Logjam = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"hstsPolicy");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"hstsPolicy");
      if (*(short *)(NVar6.i64 + 0xe) != 3) goto LAB_0010e976;
      local_90.n = NVar6;
      parseHstsPolicy((ConstObject *)&local_90.s,&(plVar5->Details).HstsPolicy);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    operator[]<char_const>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)obj->value_,"hstsPreloads");
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"hpkpPolicy");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"hpkpPolicy");
      if (*(short *)(NVar6.i64 + 0xe) != 3) goto LAB_0010e976;
      local_90.n = NVar6;
      parseHpkpPolicy((ConstObject *)&local_90.s,&(plVar5->Details).HpkpPolicy);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"hpkpRoPolicy");
    if ((pGVar7->data_).f.flags == 3) {
      NVar6 = (Number)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)obj->value_,"hpkpRoPolicy");
      if (*(short *)(NVar6.i64 + 0xe) != 3) {
LAB_0010e976:
        __assert_fail("IsObject()",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                      ,0x65e,
                      "ConstObject rapidjson::GenericValue<rapidjson::UTF8<>>::GetObject() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      local_90.n = NVar6;
      parseHpkpPolicy((ConstObject *)&local_90.s,&(plVar5->Details).HpkpRoPolicy);
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"drownErrors");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"drownErrors");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) goto LAB_0010e995;
      (plVar5->Details).DrownErrors = uVar1 == 10;
    }
  }
  pGVar10 = obj->value_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_90.s,(Ch *)pGVar10);
  uVar4 = local_90.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(pGVar10);
  if (uVar4 != NVar6.i64) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj->value_,"drownVulnerable");
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj->value_,"drownVulnerable");
      uVar1 = (pGVar7->data_).f.flags;
      if ((uVar1 & 8) == 0) {
LAB_0010e995:
        __assert_fail("IsBool()",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                      ,0x498,
                      "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      (plVar5->Details).DrownVulnerable = uVar1 == 10;
    }
  }
  return;
}

Assistant:

void Endpoint::parseEndpointDetails(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::ConstObject & obj, labsEndpoint_t &endpoint) {

        if (obj.HasMember("hostStartTime") && obj["hostStartTime"].IsInt64()) {
            endpoint.Details.HostStartTime = obj["hostStartTime"].GetInt64();
        }

        if (obj.HasMember("key") && obj["key"].IsObject()) {
            Endpoint::parseKey(obj["key"].GetObject(), endpoint.Details.Key);
        }

        if (obj.HasMember("cert") && obj["cert"].IsObject()) {
            Endpoint::parseCert(obj["cert"].GetObject(), endpoint.Details.Cert);
        }

        if (obj.HasMember("chain") && obj["chain"].IsObject()) {
            Endpoint::parseChain(obj["chain"].GetObject(), endpoint.Details.Chain);
        }

        if (obj.HasMember("protocols") && obj["protocols"].IsArray()) {
            labsProtocol_t labsProtocol;

            for (auto itr = obj["protocols"].GetArray().Begin(); itr != obj["protocols"].GetArray().End(); itr++) {
                parseProtocosls(itr->GetObject(), labsProtocol);
                endpoint.Details.Protocols.push_back(labsProtocol);
            }
        }

        if (obj.HasMember("suites") && obj["suites"].IsObject()) {
            Endpoint::parseLabsSuites(obj["suites"].GetObject(), endpoint.Details.Suites);
        }

        if (obj.HasMember("serverSignature") && obj["serverSignature"].IsString()) {
            endpoint.Details.ServerSignature = obj["serverSignature"].GetString();
        }

        if (obj.HasMember("prefixDelegation") && obj["prefixDelegation"].IsBool()) {
            endpoint.Details.PrefixDelegation = obj["prefixDelegation"].GetBool();
        }

        if (obj.HasMember("nonPrefixDelegation") && obj["nonPrefixDelegation"].IsBool()) {
            endpoint.Details.NonPrefixDelegation = obj["nonPrefixDelegation"].GetBool();
        }

        if (obj.HasMember("vulnBeast") && obj["vulnBeast"].IsBool()) {
            endpoint.Details.VulnBeast = obj["vulnBeast"].GetBool();
        }

        if (obj.HasMember("renegSupport") && obj["renegSupport"].IsInt()) {
            endpoint.Details.RenegSupport = obj["renegSupport"].GetInt();
        }

        // * TODO: need to parse stsStatus & sts.. any variable;

        if (obj.HasMember("sessionResumption") && obj["sessionResumption"].IsInt()) {
            endpoint.Details.SessionResumption = obj["sessionResumption"].GetInt();
        }

        if (obj.HasMember("compressionMethods") && obj["compressionMethods"].IsInt()) {
            endpoint.Details.CompressionMethods = obj["compressionMethods"].GetInt();
        }

        if (obj.HasMember("supportsNpn") && obj["supportsNpn"].IsBool()) {
            endpoint.Details.SupportsNpn = obj["supportsNpn"].GetBool();
        }

        if (obj.HasMember("sessionTickets") && obj["sessionTickets"].IsInt()) {
            endpoint.Details.SessionTickets = obj["sessionTickets"].GetInt();
        }

        if (obj.HasMember("ocspStapling") && obj["ocspStapling"].IsBool()) {
            endpoint.Details.OcspStapling = obj["ocspStapling"].GetBool();
        }

        if (obj.HasMember("sniRequired") && obj["sniRequired"].IsBool()) {
            endpoint.Details.SniRequired = obj["sniRequired"].GetBool();
        }

        if (obj.HasMember("httpStatusCode") && obj["httpStatusCode"].IsInt()) {
            endpoint.Details.HttpStatusCode = obj["httpStatusCode"].GetInt();
        }

        if (obj.HasMember("supportsRc4") && obj["supportsRc4"].IsBool()) {
            endpoint.Details.SupportsRc4 = obj["supportsRc4"].GetBool();
        }

        if (obj.HasMember("rc4WithModern") && obj["rc4WithModern"].IsBool()) {
            endpoint.Details.Rc4WithModern = obj["rc4WithModern"].GetBool();
        }

        if (obj.HasMember("rc4Only") && obj["rc4Only"].IsBool()) {
            endpoint.Details.Rc4Only = obj["rc4Only"].GetBool();
        }

        if (obj.HasMember("forwardSecrecy") && obj["forwardSecrecy"].IsInt()) {
            endpoint.Details.ForwardSecrecy = obj["forwardSecrecy"].GetInt();
        }

        if (obj.HasMember("sims") && obj["sims"].IsObject()) {
            parseSimulationDetails(obj["sims"].GetObject(), endpoint.Details.Sims);
        }

        if (obj.HasMember("heartbleed") && obj["heartbleed"].IsBool()) {
            endpoint.Details.Heartbleed = obj["heartbleed"].GetBool();
        }

        if (obj.HasMember("heartbeat") && obj["heartbeat"].IsBool()) {
            endpoint.Details.Heartbeat = obj["heartbeat"].GetBool();
        }

        if (obj.HasMember("openSslCcs") && obj["openSslCcs"].IsInt()) {
            endpoint.Details.OpenSslCcs = obj["openSslCcs"].GetInt();
        }

        if (obj.HasMember("poodle") && obj["poodle"].IsBool()) {
            endpoint.Details.Poodle = obj["poodle"].GetBool();
        }

        if (obj.HasMember("poodleTls") && obj["poodleTls"].IsInt()) {
            endpoint.Details.PoodleTls = obj["poodleTls"].GetInt();
        }

        if (obj.HasMember("fallbackScsv") && obj["fallbackScsv"].IsBool()) {
            endpoint.Details.FallbackScsv = obj["fallbackScsv"].GetBool();
        }

        if (obj.HasMember("freak") && obj["freak"].IsBool()) {
            endpoint.Details.Freak = obj["freak"].GetBool();
        }

        if (obj.HasMember("hasSct") && obj["hasSct"].IsInt()) {
            endpoint.Details.HasSct = obj["hasSct"].GetInt();
        }

        if (obj.HasMember("dhPrimes") && obj["dhPrimes"].IsArray()) {
            for (auto itr = obj["dhPrimes"].GetArray().Begin(); itr != obj["dhPrimes"].GetArray().End(); itr++) {
                if (itr->IsString()) {
                    endpoint.Details.DhPrimes.push_back(itr->GetString());
                }
            }
        }

        if (obj.HasMember("dhUsesKnownPrimes") && obj["dhUsesKnownPrimes"].IsInt()) {
            endpoint.Details.DhUsesKnownPrimes = obj["dhUsesKnownPrimes"].GetInt();
        }

        if (obj.HasMember("dhYsReuse") && obj["dhYsReuse"].IsBool()) {
            endpoint.Details.DhYsReuse = obj["dhYsReuse"].GetBool();
        }

        if (obj.HasMember("logjam") && obj["logjam"].IsBool()) {
            endpoint.Details.Logjam = obj["logjam"].GetBool();
        }

        if (obj.HasMember("hstsPolicy") && obj["hstsPolicy"].IsObject()) {
            Endpoint::parseHstsPolicy(obj["hstsPolicy"].GetObject(), endpoint.Details.HstsPolicy);
        }

        if (obj.HasMember("hstsPreloads") && obj["hstsPreloads"].IsArray()) {

        }

        if (obj.HasMember("hpkpPolicy") && obj["hpkpPolicy"].IsObject()) {
            Endpoint::parseHpkpPolicy(obj["hpkpPolicy"].GetObject(), endpoint.Details.HpkpPolicy);
        }

        if (obj.HasMember("hpkpRoPolicy") && obj["hpkpRoPolicy"].IsObject()) {
            Endpoint::parseHpkpPolicy(obj["hpkpRoPolicy"].GetObject(), endpoint.Details.HpkpRoPolicy);
        }

        // * TODO: need to parse drownHosts;

        if (obj.HasMember("drownErrors") && obj["drownErrors"].IsBool()) {
            endpoint.Details.DrownErrors = obj["drownErrors"].GetBool();
        }

        if (obj.HasMember("drownVulnerable") && obj["drownVulnerable"].IsBool()) {
            endpoint.Details.DrownVulnerable = obj["drownVulnerable"].GetBool();
        }

        return;
    }